

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001a3d70 = 0x2d2d2d2d2d2d2d;
    uRam00000000001a3d77._0_1_ = '-';
    uRam00000000001a3d77._1_1_ = '-';
    uRam00000000001a3d77._2_1_ = '-';
    uRam00000000001a3d77._3_1_ = '-';
    uRam00000000001a3d77._4_1_ = '-';
    uRam00000000001a3d77._5_1_ = '-';
    uRam00000000001a3d77._6_1_ = '-';
    uRam00000000001a3d77._7_1_ = '-';
    DAT_001a3d60 = '-';
    DAT_001a3d60_1._0_1_ = '-';
    DAT_001a3d60_1._1_1_ = '-';
    DAT_001a3d60_1._2_1_ = '-';
    DAT_001a3d60_1._3_1_ = '-';
    DAT_001a3d60_1._4_1_ = '-';
    DAT_001a3d60_1._5_1_ = '-';
    DAT_001a3d60_1._6_1_ = '-';
    uRam00000000001a3d68 = 0x2d2d2d2d2d2d2d;
    DAT_001a3d6f = 0x2d;
    DAT_001a3d50 = '-';
    DAT_001a3d50_1._0_1_ = '-';
    DAT_001a3d50_1._1_1_ = '-';
    DAT_001a3d50_1._2_1_ = '-';
    DAT_001a3d50_1._3_1_ = '-';
    DAT_001a3d50_1._4_1_ = '-';
    DAT_001a3d50_1._5_1_ = '-';
    DAT_001a3d50_1._6_1_ = '-';
    uRam00000000001a3d58._0_1_ = '-';
    uRam00000000001a3d58._1_1_ = '-';
    uRam00000000001a3d58._2_1_ = '-';
    uRam00000000001a3d58._3_1_ = '-';
    uRam00000000001a3d58._4_1_ = '-';
    uRam00000000001a3d58._5_1_ = '-';
    uRam00000000001a3d58._6_1_ = '-';
    uRam00000000001a3d58._7_1_ = '-';
    DAT_001a3d40 = '-';
    DAT_001a3d40_1._0_1_ = '-';
    DAT_001a3d40_1._1_1_ = '-';
    DAT_001a3d40_1._2_1_ = '-';
    DAT_001a3d40_1._3_1_ = '-';
    DAT_001a3d40_1._4_1_ = '-';
    DAT_001a3d40_1._5_1_ = '-';
    DAT_001a3d40_1._6_1_ = '-';
    uRam00000000001a3d48._0_1_ = '-';
    uRam00000000001a3d48._1_1_ = '-';
    uRam00000000001a3d48._2_1_ = '-';
    uRam00000000001a3d48._3_1_ = '-';
    uRam00000000001a3d48._4_1_ = '-';
    uRam00000000001a3d48._5_1_ = '-';
    uRam00000000001a3d48._6_1_ = '-';
    uRam00000000001a3d48._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001a3d38._0_1_ = '-';
    uRam00000000001a3d38._1_1_ = '-';
    uRam00000000001a3d38._2_1_ = '-';
    uRam00000000001a3d38._3_1_ = '-';
    uRam00000000001a3d38._4_1_ = '-';
    uRam00000000001a3d38._5_1_ = '-';
    uRam00000000001a3d38._6_1_ = '-';
    uRam00000000001a3d38._7_1_ = '-';
    DAT_001a3d7f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}